

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O3

int __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLW2_NLFeeder_C_Impl>_>::
WriteStringVec2File(NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLW2_NLFeeder_C_Impl>_>
                    *this,string *name,function<void_(mp::StringFileWriter_&)> *swf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  int lMax;
  StringFileWriter sw;
  int local_a4;
  _Any_data local_a0;
  code *local_90;
  anon_class_40_2_9bb43b96 local_80;
  StringFileWriter local_58;
  
  local_a4 = 0;
  paVar1 = &local_80.name.field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  local_80.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar2,pcVar2 + name->_M_string_length);
  local_80.this = this;
  std::function<mp::File(bool)>::
  function<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,mp::NLW2_NLFeeder_C_Impl>>::WriteStringVec2File(std::__cxx11::string_const&,std::function<void(mp::StringFileWriter&)>)::_lambda(bool)_1_,void>
            ((function<mp::File(bool)> *)local_a0._M_pod_data,&local_80);
  local_58.len_max_ = &local_a4;
  std::function<mp::File_(bool)>::function(&local_58.opener_,(function<mp::File_(bool)> *)&local_a0)
  ;
  local_58.nm.f_ = (FILE *)0x0;
  local_58.fTriedOpen_ = false;
  local_58.cnt_ = 0;
  if (local_90 != (code *)0x0) {
    (*local_90)(&local_a0,&local_a0,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.name._M_dataplus._M_p,local_80.name.field_2._M_allocated_capacity + 1);
  }
  if ((swf->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*swf->_M_invoker)((_Any_data *)swf,&local_58);
    iVar3 = local_a4;
    StringFileWriter::~StringFileWriter(&local_58);
    return iVar3;
  }
  std::__throw_bad_function_call();
}

Assistant:

int NLWriter2<Params>::WriteStringVec2File(
    const std::string& name, std::function<void(StringFileWriter&)> swf) {
  int lMax=0;
  StringFileWriter sw(lMax,
                      [name, this](bool fClose){
    return Utils().openf(name.c_str(),
                         fClose, "w");
  });
  swf(sw);
  return lMax;
}